

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excitation_generation.cc
# Opt level: O0

void __thiscall
sptk::ExcitationGeneration::ExcitationGeneration
          (ExcitationGeneration *this,InputSourceInterpolationWithMagicNumber *input_source,
          RandomGenerationInterface *random_generation)

{
  ulong uVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ExcitationGeneration_00128b10;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RDX;
  *(undefined1 *)(in_RDI + 3) = 1;
  in_RDI[4] = 0x3ff0000000000000;
  if ((in_RDI[1] != 0) && (uVar1 = (**(code **)(*(long *)in_RDI[1] + 0x18))(), (uVar1 & 1) != 0)) {
    return;
  }
  *(undefined1 *)(in_RDI + 3) = 0;
  return;
}

Assistant:

ExcitationGeneration::ExcitationGeneration(
    InputSourceInterpolationWithMagicNumber* input_source,
    RandomGenerationInterface* random_generation)
    : input_source_(input_source),
      random_generation_(random_generation),
      is_valid_(true),
      phase_(1.0) {
  if (NULL == input_source_ || !input_source_->IsValid()) {
    is_valid_ = false;
    return;
  }
}